

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O2

ssl_hs_wait_t bssl::tls13_client_handshake(SSL_HANDSHAKE *hs)

{
  UniquePtr<SSL_SESSION> *this;
  UniquePtr<SSL_CREDENTIAL> *this_00;
  SSLTranscript *this_01;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> *this_02;
  SSLTranscript *other;
  byte bVar1;
  ushort uVar2;
  int iVar3;
  ECHConfig *pEVar4;
  ssl_session_st *psVar5;
  CERT *pCVar6;
  _func_int_SSL_ptr_void_ptr *p_Var7;
  SSL_CREDENTIAL *cred;
  SSL_SESSION *pSVar8;
  Prover *pPVar9;
  SSLKeyShare *pSVar10;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> rhs;
  Span<const_unsigned_char> lhs;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Span<const_unsigned_char> traffic_secret;
  Span<const_unsigned_char> traffic_secret_00;
  Span<const_unsigned_char> traffic_secret_01;
  Span<const_unsigned_char> traffic_secret_02;
  Span<const_unsigned_char> in_02;
  SSLMessage *__p_00;
  uint8_t *puVar14;
  bool bVar15;
  bool bVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  ssl_private_key_result_t sVar19;
  ssl_verify_result_t sVar20;
  int iVar21;
  SSLSessionType SVar22;
  SSL_CIPHER *cipher;
  SSL3_STATE *pSVar23;
  uchar *puVar24;
  ulong uVar25;
  OPENSSL_STACK *__p_01;
  EVP_MD *md;
  undefined4 extraout_var;
  size_t sVar26;
  CBS *contents;
  uint uVar27;
  SSL *pSVar28;
  ssl_encryption_level_t level;
  undefined1 *puVar29;
  int iVar30;
  ulong in_R9;
  pointer __p;
  ssl_hs_wait_t sVar31;
  long lVar32;
  long lVar33;
  initializer_list<bssl::SSLExtension_*> extensions;
  Span<const_unsigned_char> in_03;
  Span<const_unsigned_char> psk;
  Span<const_unsigned_char> in_04;
  Span<const_unsigned_char> in_05;
  ssl_hs_wait_t sStackY_1f0;
  undefined1 auStack_1e8 [15];
  bool ech_accepted;
  uint8_t alert;
  undefined7 uStack_1d7;
  CBS *local_1d0;
  CBS cookie_value;
  SSLExtension key_share;
  ParsedServerHello server_hello;
  SSLExtension ech_unused;
  SSLExtension supported_versions;
  SSLMessage msg;
  SSLExtension cookie;
  
  this = &hs->new_session;
  this_00 = &hs->credential;
  this_01 = &hs->transcript;
  this_02 = &hs->ca_names;
  other = &hs->inner_transcript;
  do {
    iVar3 = hs->tls13_state;
    sVar31 = ssl_hs_error;
    switch(iVar3) {
    case 0:
      pSVar28 = hs->ssl;
      if (pSVar28->s3->version == 0) {
        __assert_fail("ssl->s3->version != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                      ,0xb9,"enum ssl_hs_wait_t bssl::do_read_hello_retry_request(SSL_HANDSHAKE *)")
        ;
      }
      bVar16 = (*pSVar28->method->get_message)(pSVar28,&msg);
      sVar31 = ssl_hs_read_message;
      if (bVar16) {
        if ((hs->field_0x6c9 & 8) == 0) {
          bVar16 = (*pSVar28->method->add_change_cipher_spec)(pSVar28);
          sVar31 = ssl_hs_error;
          if (!bVar16) break;
        }
        server_hello.legacy_version = 0;
        server_hello.cipher_suite = 0;
        server_hello.compression_method = '\0';
        _alert = (SSLMessage *)CONCAT71(uStack_1d7,0x32);
        bVar16 = parse_server_hello_tls13(hs,&server_hello,&alert,&msg);
        if (!bVar16) goto LAB_0015dccb;
        cipher = SSL_get_cipher_by_value(server_hello.cipher_suite);
        if (cipher != (SSL_CIPHER *)0x0) {
          uVar18 = SSL_CIPHER_get_min_version(cipher);
          uVar17 = ssl_protocol_version(pSVar28);
          if (uVar18 <= uVar17) {
            uVar18 = SSL_CIPHER_get_max_version(cipher);
            uVar17 = ssl_protocol_version(pSVar28);
            if (uVar17 <= uVar18) {
              uVar18 = SSL_CIPHER_get_protocol_id(cipher);
              bVar16 = ssl_tls13_cipher_meets_policy
                                 (uVar18,((pSVar28->config)._M_t.
                                          super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>.
                                         _M_head_impl)->compliance_policy);
              if (bVar16) {
                hs->new_cipher = cipher;
                bVar16 = is_hello_retry_request(&server_hello);
                uVar18 = ssl_protocol_version(pSVar28);
                bVar15 = SSLTranscript::InitHash(this_01,uVar18,hs->new_cipher);
                sVar31 = ssl_hs_error;
                if ((!bVar15) ||
                   ((bVar16 &&
                    (bVar15 = SSLTranscript::UpdateForHelloRetryRequest(this_01), !bVar15)))) break;
                if ((hs->selected_ech_config)._M_t.
                    super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl != (ECHConfig *)0x0
                   ) {
                  uVar18 = ssl_protocol_version(pSVar28);
                  bVar15 = SSLTranscript::InitHash(other,uVar18,hs->new_cipher);
                  if ((!bVar15) ||
                     ((bVar16 &&
                      (bVar15 = SSLTranscript::UpdateForHelloRetryRequest(other), !bVar15)))) break;
                }
                bVar15 = check_ech_confirmation(hs,&ech_accepted,&alert,&server_hello);
                if (bVar15) {
                  pEVar4 = (hs->selected_ech_config)._M_t.
                           super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl;
                  if (pEVar4 != (ECHConfig *)0x0) {
                    pSVar28->s3->ech_status = ssl_ech_rejected - ech_accepted;
                  }
                  if (!bVar16) {
                    hs->tls13_state = 2;
                    goto LAB_0015db50;
                  }
                  cookie.type = 0x2c;
                  cookie.allowed = true;
                  cookie.present = false;
                  cookie.data.data = (uint8_t *)0x0;
                  cookie.data.len = 0;
                  key_share.allowed = (hs->key_share_bytes).size_ != 0;
                  key_share.type = 0x33;
                  key_share.present = false;
                  key_share.data.data = (uint8_t *)0x0;
                  key_share.data.len = 0;
                  supported_versions.type = 0x2b;
                  supported_versions.allowed = true;
                  supported_versions.present = false;
                  supported_versions.data.data = (uint8_t *)0x0;
                  supported_versions.data.len = 0;
                  ech_unused.allowed = true;
                  if (pEVar4 == (ECHConfig *)0x0) {
                    ech_unused.allowed = (bool)(hs->config->field_0x10d & 1);
                  }
                  ech_unused.type = 0xfe0d;
                  ech_unused.present = false;
                  ech_unused.data.data = (uint8_t *)0x0;
                  ech_unused.data.len = 0;
                  cookie_value.data = (uint8_t *)&cookie;
                  cookie_value.len = (size_t)&key_share;
                  bVar16 = ssl_parse_extensions
                                     ((bssl *)&server_hello.extensions,(CBS *)&alert,
                                      (uint8_t *)&cookie_value,
                                      (initializer_list<bssl::SSLExtension_*>)ZEXT816(4),
                                      SUB81(in_R9,0));
                  if (bVar16) {
                    if (cookie.present == false) {
                      if (key_share.present == false) {
                        iVar21 = 0x11a;
                        iVar30 = 0x10c;
                        goto LAB_0015e344;
                      }
                    }
                    else {
                      iVar21 = CBS_get_u16_length_prefixed(&cookie.data,&cookie_value);
                      if (((iVar21 == 0) || (cookie_value.len == 0)) || (cookie.data.len != 0)) {
                        iVar21 = 0x115;
                        goto LAB_0015de1d;
                      }
                      in_03.size_ = cookie_value.len;
                      in_03.data_ = cookie_value.data;
                      bVar16 = Array<unsigned_char>::CopyFrom(&hs->cookie,in_03);
                      if (!bVar16) goto LAB_0015e517;
                    }
                    if ((key_share.present & 1U) != 0) {
                      if ((hs->pake_prover)._M_t.
                          super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>.
                          _M_t.
                          super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>
                          .super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl !=
                          (Prover *)0x0) {
                        __assert_fail("!hs->pake_prover",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                                      ,0x122,
                                      "enum ssl_hs_wait_t bssl::do_read_hello_retry_request(SSL_HANDSHAKE *)"
                                     );
                      }
                      iVar21 = CBS_get_u16(&key_share.data,(uint16_t *)&cookie_value);
                      if ((iVar21 == 0) || (key_share.data.len != 0)) {
                        ERR_put_error(0x10,0,0x89,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                                      ,0x127);
                        uVar27 = 0x32;
                        goto LAB_0015e512;
                      }
                      bVar16 = tls1_check_group_id(hs,(uint16_t)cookie_value.data);
                      if (bVar16) {
                        iVar21 = (*(hs->key_shares[0]._M_t.
                                    super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl)
                                   ->_vptr_SSLKeyShare[2])();
                        if ((short)iVar21 != (uint16_t)cookie_value.data) {
                          pSVar10 = hs->key_shares[1]._M_t.
                                    super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl;
                          if (pSVar10 != (SSLKeyShare *)0x0) {
                            iVar21 = (*pSVar10->_vptr_SSLKeyShare[2])();
                            if ((short)iVar21 == (uint16_t)cookie_value.data) goto LAB_0015e648;
                          }
                          bVar16 = ssl_setup_key_shares(hs,(uint16_t)cookie_value.data);
                          if (!bVar16) goto LAB_0015e517;
                          goto LAB_0015e91d;
                        }
LAB_0015e648:
                        ssl_send_alert(pSVar28,2,0x2f);
                        iVar21 = 0x138;
                      }
                      else {
                        ssl_send_alert(pSVar28,2,0x2f);
                        iVar21 = 0x12f;
                      }
                      ERR_put_error(0x10,0,0xf3,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                                    ,iVar21);
                      goto LAB_0015e517;
                    }
LAB_0015e91d:
                    bVar16 = ssl_hash_message(hs,&msg);
                    sVar31 = ssl_hs_error;
                    if ((bVar16) &&
                       ((pSVar28->s3->ech_status != ssl_ech_accepted ||
                        (in_02.size_ = msg.raw.len, in_02.data_ = msg.raw.data,
                        bVar16 = SSLTranscript::Update(other,in_02), bVar16)))) {
                      bVar16 = (*pSVar28->method->has_unprocessed_handshake_data)(pSVar28);
                      if (bVar16) {
                        ssl_send_alert(pSVar28,2,10);
                        iVar21 = 0xff;
                        iVar30 = 0x150;
                        goto LAB_0015deb5;
                      }
                      (*pSVar28->method->next_message)(pSVar28);
                      puVar29 = &pSVar28->s3->field_0xdc;
                      *(ushort *)puVar29 = *(ushort *)puVar29 | 0x1000;
                      hs->tls13_state = 1;
                      sVar31 = ssl_hs_ok;
                      if ((hs->field_0x6c9 & 4) != 0) {
                        pSVar28->s3->early_data_reason = ssl_early_data_hello_retry_request;
                        level = ssl_encryption_initial;
                        goto LAB_0015d6cc;
                      }
                    }
                    break;
                  }
                }
LAB_0015dccb:
                uVar27 = (uint)alert;
                goto LAB_0015e512;
              }
            }
          }
        }
        iVar21 = 0xf2;
        iVar30 = 0xd7;
        goto LAB_0015e344;
      }
      break;
    case 1:
      if (hs->ssl->s3->ech_status == ssl_ech_accepted) {
        sVar31 = ssl_hs_error;
        bVar16 = ssl_encrypt_client_hello
                           ((bssl *)hs,(SSL_HANDSHAKE *)0x0,
                            (Span<const_unsigned_char>)(ZEXT816(0x21afd0) << 0x40));
        if (!bVar16) break;
      }
      bVar16 = ssl_add_client_hello(hs);
      sVar31 = ssl_hs_error;
      if (bVar16) {
        ssl_done_writing_client_hello(hs);
        hs->tls13_state = 2;
LAB_0015d770:
        sVar31 = ssl_hs_flush;
      }
      break;
    case 2:
      pSVar28 = hs->ssl;
      bVar16 = (*pSVar28->method->get_message)(pSVar28,&msg);
      sVar31 = ssl_hs_read_message;
      if (bVar16) {
        server_hello.legacy_version = 0;
        server_hello.cipher_suite = 0;
        server_hello.compression_method = '\0';
        ech_accepted = true;
        bVar16 = parse_server_hello_tls13(hs,&server_hello,&ech_accepted,&msg);
        if (bVar16) {
          bVar16 = is_hello_retry_request(&server_hello);
          if (bVar16) {
            ssl_send_alert(pSVar28,2,10);
            iVar21 = 0xdf;
            iVar30 = 0x183;
LAB_0015deb5:
            sVar31 = ssl_hs_error;
            ERR_put_error(0x10,0,iVar21,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,iVar30);
            break;
          }
          uVar18 = SSL_CIPHER_get_protocol_id(hs->new_cipher);
          if (uVar18 != server_hello.cipher_suite) {
            iVar21 = 0xf2;
            iVar30 = 0x189;
            goto LAB_0015e344;
          }
          pSVar23 = pSVar28->s3;
          if (pSVar23->ech_status == ssl_ech_accepted) {
            if ((pSVar23->field_0xdd & 0x10) != 0) {
              bVar16 = check_ech_confirmation(hs,(bool *)&cookie_value,&ech_accepted,&server_hello);
              if (!bVar16) goto LAB_0015e507;
              if ((char)cookie_value.data != '\0') goto LAB_0015dd7e;
              ERR_put_error(0x10,0,0x141,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x197);
              uVar27 = 0x2f;
              goto LAB_0015e512;
            }
LAB_0015dd7e:
            SSLTranscript::operator=(this_01,other);
            hs->extensions = (anon_union_4_2_c8db58f8_for_extensions)hs->inner_extensions_sent;
            pSVar23 = pSVar28->s3;
            uVar11 = *(undefined8 *)hs->inner_client_random;
            uVar12 = *(undefined8 *)(hs->inner_client_random + 8);
            uVar13 = *(undefined8 *)(hs->inner_client_random + 0x18);
            *(undefined8 *)(pSVar23->client_random + 0x10) =
                 *(undefined8 *)(hs->inner_client_random + 0x10);
            *(undefined8 *)(pSVar23->client_random + 0x18) = uVar13;
            *(undefined8 *)pSVar23->client_random = uVar11;
            *(undefined8 *)(pSVar23->client_random + 8) = uVar12;
            pSVar23 = pSVar28->s3;
          }
          uVar11 = *(undefined8 *)server_hello.random.data;
          uVar12 = *(undefined8 *)(server_hello.random.data + 8);
          uVar13 = *(undefined8 *)(server_hello.random.data + 0x18);
          *(undefined8 *)(pSVar23->server_random + 0x10) =
               *(undefined8 *)(server_hello.random.data + 0x10);
          *(undefined8 *)(pSVar23->server_random + 0x18) = uVar13;
          *(undefined8 *)pSVar23->server_random = uVar11;
          *(undefined8 *)(pSVar23->server_random + 8) = uVar12;
          pSVar8 = (pSVar28->session)._M_t.
                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          if ((pSVar8 == (SSL_SESSION *)0x0) ||
             (SVar22 = ssl_session_get_type(pSVar8), SVar22 != kPreSharedKey)) {
            supported_versions.allowed = false;
          }
          else {
            supported_versions.allowed = pSVar28->s3->ech_status != ssl_ech_rejected;
          }
          uVar11 = cookie._0_8_;
          cookie.allowed =
               hs->key_shares[0]._M_t.
               super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl != (SSLKeyShare *)0x0;
          cookie.type = 0x33;
          cookie._4_4_ = SUB84(uVar11,4);
          cookie.present = false;
          cookie.data.data = (uint8_t *)0x0;
          cookie.data.len = 0;
          key_share.allowed =
               (hs->pake_prover)._M_t.
               super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl !=
               (Prover *)0x0;
          key_share.type = 0x8a3b;
          key_share.present = false;
          key_share.data.data = (uint8_t *)0x0;
          key_share.data.len = 0;
          supported_versions.type = 0x29;
          supported_versions.present = false;
          supported_versions.data.data = (uint8_t *)0x0;
          supported_versions.data.len = 0;
          ech_unused.type = 0x2b;
          ech_unused.allowed = true;
          ech_unused.present = false;
          ech_unused.data.data = (uint8_t *)0x0;
          ech_unused.data.len = 0;
          cookie_value.data = (uint8_t *)&cookie;
          cookie_value.len = (size_t)&supported_versions;
          bVar16 = ssl_parse_extensions
                             ((bssl *)&server_hello.extensions,(CBS *)&ech_accepted,
                              (uint8_t *)&cookie_value,
                              (initializer_list<bssl::SSLExtension_*>)ZEXT816(4),SUB81(in_R9,0));
          if (!bVar16) goto LAB_0015e507;
          if ((((ech_unused.present != true) ||
               (iVar21 = CBS_get_u16(&ech_unused.data,(uint16_t *)&alert), iVar21 == 0)) ||
              (ech_unused.data.len != 0)) || (_alert != pSVar28->s3->version)) {
            iVar21 = 0x120;
            iVar30 = 0x1bf;
            goto LAB_0015e344;
          }
          if (key_share.present == true) {
            if ((cookie.present != false) || (supported_versions.present == true)) {
              ERR_put_error(0x10,0,0xde,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x1c9);
              iVar21 = 0x6e;
              goto LAB_0015e351;
            }
            pPVar9 = (hs->pake_prover)._M_t.
                     super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl;
joined_r0x0015e399:
            if (pPVar9 != (Prover *)0x0) {
              ech_accepted = true;
              if (supported_versions.present != false) {
                bVar16 = ssl_ext_pre_shared_key_parse_serverhello
                                   (hs,&ech_accepted,&supported_versions.data);
                if (!bVar16) goto LAB_0015e507;
                pSVar8 = (pSVar28->session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                if (pSVar8->ssl_version == pSVar28->s3->version) {
                  if (pSVar8->cipher->algorithm_prf == hs->new_cipher->algorithm_prf) {
                    bVar16 = ssl_session_is_context_valid(hs,pSVar8);
                    if (bVar16) {
                      puVar29 = &pSVar28->s3->field_0xdc;
                      *(ushort *)puVar29 = *(ushort *)puVar29 | 0x20;
                      hs->field_0x6ca = hs->field_0x6ca | 0x80;
                      SSL_SESSION_dup((bssl *)&cookie_value,
                                      (pSVar28->session)._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,0
                                     );
                      puVar14 = cookie_value.data;
                      cookie_value.data = (uint8_t *)0x0;
                      std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                                ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)this,
                                 (pointer)puVar14);
                      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                                 &cookie_value);
                      if ((hs->new_session)._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
                          (ssl_session_st *)0x0) goto LAB_0015e5a5;
                      ssl_set_session(pSVar28,(SSL_SESSION *)0x0);
                      ssl_session_renew_timeout
                                (pSVar28,(this->_M_t).
                                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                         _M_head_impl,
                                 ((pSVar28->session_ctx)._M_t.
                                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->
                                 session_psk_dhe_timeout);
                      goto LAB_0015e554;
                    }
                    iVar21 = 0x65;
                    iVar30 = 0x1fc;
                  }
                  else {
                    iVar21 = 0x10c;
                    iVar30 = 500;
                  }
                }
                else {
                  iVar21 = 0xbc;
                  iVar30 = 0x1ee;
                }
LAB_0015e344:
                ERR_put_error(0x10,0,iVar21,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,iVar30);
                iVar21 = 0x2f;
                goto LAB_0015e351;
              }
              bVar16 = ssl_get_new_session(hs);
              if (!bVar16) {
LAB_0015e5a5:
                uVar27 = 0x50;
                goto LAB_0015e512;
              }
LAB_0015e554:
              ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
               ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->cipher = hs->new_cipher
              ;
              uVar18 = ssl_protocol_version(pSVar28);
              md = (EVP_MD *)ssl_get_handshake_digest(uVar18,hs->new_cipher);
              iVar21 = EVP_MD_size(md);
              uVar25 = CONCAT44(extraout_var,iVar21);
              if ((pSVar28->s3->field_0xdc & 0x20) == 0) {
                puVar29 = kZeroes;
              }
              else {
                psVar5 = (this->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                         ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                uVar25 = (ulong)(psVar5->secret).size_;
                puVar29 = (psVar5->secret).storage_;
              }
              psk.size_ = uVar25;
              psk.data_ = puVar29;
              bVar16 = tls13_init_key_schedule(hs,psk);
              sVar31 = ssl_hs_error;
              if (!bVar16) break;
              cookie_value.data = (uint8_t *)0x0;
              cookie_value.len = 0;
              ech_accepted = true;
              if (cookie.present == true) {
                contents = &cookie.data;
                bVar16 = ssl_ext_key_share_parse_serverhello
                                   (hs,(Array<unsigned_char> *)&cookie_value,&ech_accepted,contents)
                ;
LAB_0015e75d:
                if (bVar16 == false) {
                  uVar27 = (uint)ech_accepted;
                  goto LAB_0015e89d;
                }
                in_05.size_ = (size_t)contents;
                in_05.data_ = (uchar *)cookie_value.len;
                bVar16 = tls13_advance_key_schedule
                                   ((bssl *)hs,(SSL_HANDSHAKE *)cookie_value.data,in_05);
                sVar31 = ssl_hs_error;
                if (((bVar16) && (bVar16 = ssl_hash_message(hs,&msg), bVar16)) &&
                   (bVar16 = tls13_derive_handshake_secrets(hs), bVar16)) {
                  sVar31 = ssl_hs_error;
                  if (((hs->field_0x6c9 & 4) == 0) || (iVar21 = SSL_is_quic(pSVar28), iVar21 != 0))
                  {
                    in_R9 = (ulong)(hs->client_handshake_secret).size_;
                    traffic_secret_01.size_._7_1_ = ech_accepted;
                    traffic_secret_01._0_15_ = auStack_1e8;
                    bVar16 = tls13_set_traffic_key
                                       ((bssl *)pSVar28,(SSL *)0x2,ssl_encryption_early_data,
                                        (evp_aead_direction_t)
                                        (hs->new_session)._M_t.
                                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl
                                        ,(SSL_SESSION *)&hs->client_handshake_secret,
                                        traffic_secret_01);
                    if (!bVar16) goto LAB_0015e8af;
                  }
                  in_R9 = (ulong)(hs->server_handshake_secret).size_;
                  traffic_secret_02.size_._7_1_ = ech_accepted;
                  traffic_secret_02._0_15_ = auStack_1e8;
                  bVar16 = tls13_set_traffic_key
                                     ((bssl *)pSVar28,(SSL *)0x2,ssl_encryption_initial,
                                      (evp_aead_direction_t)
                                      (hs->new_session)._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                      (SSL_SESSION *)&hs->server_handshake_secret,traffic_secret_02)
                  ;
                  if (bVar16) {
                    (*pSVar28->method->next_message)(pSVar28);
                    hs->tls13_state = 3;
                    sVar31 = ssl_hs_ok;
                  }
                }
              }
              else {
                if (key_share.present == true) {
                  contents = &key_share.data;
                  bVar16 = ssl_ext_pake_parse_serverhello
                                     (hs,(Array<unsigned_char> *)&cookie_value,&ech_accepted,
                                      contents);
                  goto LAB_0015e75d;
                }
                uVar27 = 0x50;
                ERR_put_error(0x10,0,0x44,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,0x22f);
LAB_0015e89d:
                sVar31 = ssl_hs_error;
                ssl_send_alert(pSVar28,2,uVar27);
              }
LAB_0015e8af:
              Array<unsigned_char>::~Array((Array<unsigned_char> *)&cookie_value);
              break;
            }
            iVar21 = 0x102;
            iVar30 = 0x1d6;
          }
          else {
            if ((hs->pake_prover)._M_t.
                super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl ==
                (Prover *)0x0) {
              pPVar9 = (Prover *)(cookie._0_8_ & 0x1000000);
              goto joined_r0x0015e399;
            }
            iVar21 = 0xa4;
            iVar30 = 0x1cf;
          }
          ERR_put_error(0x10,0,iVar21,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,iVar30);
          iVar21 = 0x6d;
LAB_0015e351:
          sVar31 = ssl_hs_error;
          ssl_send_alert(pSVar28,2,iVar21);
        }
        else {
LAB_0015e507:
          uVar27 = (uint)ech_accepted;
LAB_0015e512:
          ssl_send_alert(pSVar28,2,uVar27);
LAB_0015e517:
          sVar31 = ssl_hs_error;
        }
      }
      break;
    case 3:
      pSVar28 = hs->ssl;
      bVar16 = (*pSVar28->method->get_message)(pSVar28,(SSLMessage *)&server_hello);
      sVar31 = ssl_hs_read_message;
      if (bVar16) {
        bVar16 = ssl_check_message_type(pSVar28,(SSLMessage *)&server_hello,8);
        sVar31 = ssl_hs_error;
        if (bVar16) {
          msg.body.data = (uint8_t *)CONCAT62(server_hello._18_6_,server_hello.legacy_version);
          msg.is_v2_hello = (bool)(undefined1)server_hello.raw.len;
          msg.type = server_hello.raw.len._1_1_;
          msg._2_6_ = server_hello.raw.len._2_6_;
          iVar21 = CBS_get_u16_length_prefixed((CBS *)&msg,&cookie_value);
          if ((iVar21 != 0) && (msg.body.data == (uint8_t *)0x0)) {
            bVar16 = ssl_parse_serverhello_tlsext(hs,&cookie_value);
            if (!bVar16) {
              iVar21 = 0xbe;
              iVar30 = 0x264;
              goto LAB_0015deb5;
            }
            pSVar23 = pSVar28->s3;
            if ((*(uint *)&pSVar23->field_0xdc >> 9 & 1) != 0) {
              if ((*(uint *)&pSVar23->field_0xdc & 0x20) == 0) {
                __assert_fail("ssl->s3->session_reused",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,0x26a,
                              "enum ssl_hs_wait_t bssl::do_read_encrypted_extensions(SSL_HANDSHAKE *)"
                             );
              }
              if (pSVar23->ech_status == ssl_ech_rejected) {
                __assert_fail("ssl->s3->ech_status != ssl_ech_rejected",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,0x26e,
                              "enum ssl_hs_wait_t bssl::do_read_encrypted_extensions(SSL_HANDSHAKE *)"
                             );
              }
              psVar5 = (hs->early_session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              if (psVar5->cipher ==
                  ((hs->new_session)._M_t.
                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->cipher) {
                lhs.data_ = (psVar5->early_alpn).data_;
                lhs.size_ = (psVar5->early_alpn).size_;
                rhs.data_ = (pSVar23->alpn_selected).data_;
                rhs.size_ = (pSVar23->alpn_selected).size_;
                bVar16 = internal::operator!=(lhs,rhs);
                if (bVar16) {
                  iVar21 = 0x115;
                  iVar30 = 0x276;
                }
                else {
                  if ((hs->field_0x6cb & 1) == 0) {
                    psVar5 = (this->_M_t).
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                    bVar1 = psVar5->field_0x1b8;
                    if ((bVar1 & 0x40) == 0) {
                      psVar5->field_0x1b8 =
                           ((hs->early_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                           field_0x1b8 & 0x40 | bVar1;
                      psVar5 = (hs->early_session)._M_t.
                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                      in_00.data_ = (psVar5->local_application_settings).data_;
                      in_00.size_ = (psVar5->local_application_settings).size_;
                      bVar16 = Array<unsigned_char>::CopyFrom
                                         (&((hs->new_session)._M_t.
                                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                           _M_head_impl)->local_application_settings,in_00);
                      if ((bVar16) &&
                         (psVar5 = (hs->early_session)._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                         in_01.data_ = (psVar5->peer_application_settings).data_,
                         in_01.size_ = (psVar5->peer_application_settings).size_,
                         bVar16 = Array<unsigned_char>::CopyFrom
                                            (&((hs->new_session)._M_t.
                                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                              _M_head_impl)->peer_application_settings,in_01),
                         bVar16)) {
                        pSVar23 = pSVar28->s3;
                        goto LAB_0015d64a;
                      }
                      goto LAB_0015e5a5;
                    }
                  }
                  iVar21 = 0x117;
                  iVar30 = 0x27e;
                }
              }
              else {
                iVar21 = 0x130;
                iVar30 = 0x271;
              }
              goto LAB_0015e344;
            }
LAB_0015d64a:
            in.data_ = (pSVar23->alpn_selected).data_;
            in.size_ = (pSVar23->alpn_selected).size_;
            bVar16 = Array<unsigned_char>::CopyFrom
                               (&((this->_M_t).
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                 early_alpn,in);
            if (bVar16) {
              bVar16 = ssl_hash_message(hs,(SSLMessage *)&server_hello);
              sVar31 = ssl_hs_error;
              if (bVar16) {
                (*pSVar28->method->next_message)(pSVar28);
                hs->tls13_state = 4;
                sVar31 = ssl_hs_ok;
                if (((hs->field_0x6c9 & 4) != 0) &&
                   (sVar31 = ssl_hs_ok, (pSVar28->s3->field_0xdd & 2) == 0)) {
                  level = ssl_encryption_handshake;
LAB_0015d6cc:
                  bVar16 = close_early_data(hs,level);
                  sVar31 = ssl_hs_error;
                  if (bVar16) {
                    sVar31 = ssl_hs_early_data_rejected;
                  }
                }
              }
              break;
            }
            goto LAB_0015e5a5;
          }
          iVar21 = 0x25e;
LAB_0015de1d:
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,iVar21);
          iVar21 = 0x32;
          goto LAB_0015e351;
        }
      }
      break;
    case 4:
      pSVar28 = hs->ssl;
      uVar2 = *(ushort *)&pSVar28->s3->field_0xdc;
      if ((uVar2 & 0x20) == 0) {
        if ((hs->pake_prover)._M_t.
            super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl == (Prover *)0x0)
        {
          bVar16 = (*pSVar28->method->get_message)(pSVar28,(SSLMessage *)&server_hello);
          sVar31 = ssl_hs_read_message;
          if (!bVar16) break;
          if (server_hello.raw.data._1_1_ != '\r') {
            hs->tls13_state = 5;
            goto LAB_0015db50;
          }
          msg.is_v2_hello = true;
          msg.type = '\0';
          msg._2_2_ = 1;
          msg.body.data = (uint8_t *)0x0;
          msg.body.len = 0;
          cookie_value.data = (uint8_t *)CONCAT44(cookie_value.data._4_4_,0x1002f);
          cookie_value.len = 0;
          cookie.data.data = (uint8_t *)CONCAT62(server_hello._18_6_,server_hello.legacy_version);
          cookie.type = (undefined2)server_hello.raw.len;
          cookie.allowed = (bool)server_hello.raw.len._2_1_;
          cookie.present = (bool)server_hello.raw.len._3_1_;
          cookie._4_4_ = server_hello.raw.len._4_4_;
          ech_accepted = true;
          iVar21 = CBS_get_u8_length_prefixed((CBS *)&cookie,(CBS *)&key_share);
          if ((((iVar21 != 0) && (key_share.data.data == (uint8_t *)0x0)) &&
              (iVar21 = CBS_get_u16_length_prefixed((CBS *)&cookie,(CBS *)&supported_versions),
              iVar21 != 0)) && (cookie.data.data == (uint8_t *)0x0)) {
            _alert = &msg;
            local_1d0 = &cookie_value;
            extensions._M_len = 1;
            extensions._M_array = (iterator)0x2;
            bVar16 = ssl_parse_extensions
                               ((bssl *)&supported_versions,(CBS *)&ech_accepted,&alert,extensions,
                                SUB81(in_R9,0));
            if (((bVar16) && (msg._3_1_ == '\x01')) &&
               ((iVar21 = CBS_get_u16_length_prefixed(&msg.body,(CBS *)&ech_unused), iVar21 != 0 &&
                (bVar16 = tls1_parse_peer_sigalgs(hs,(CBS *)&ech_unused), bVar16)))) {
              if (cookie_value.data._3_1_ == '\x01') {
                SSL_parse_CA_list((bssl *)&alert,pSVar28,&ech_accepted,(CBS *)&cookie_value.len);
                __p_00 = _alert;
                _alert = (SSLMessage *)0x0;
                std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                           this_02,(pointer)__p_00);
                std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&alert);
                if ((this_02->_M_t).
                    super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl !=
                    (stack_st_CRYPTO_BUFFER *)0x0) {
LAB_0015e3d0:
                  hs->field_0x6c8 = hs->field_0x6c8 | 0x20;
                  (*((pSVar28->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->
                    hs_flush_cached_ca_names)(hs);
                  bVar16 = ssl_hash_message(hs,(SSLMessage *)&server_hello);
                  sVar31 = ssl_hs_error;
                  if (bVar16) {
                    (*pSVar28->method->next_message)(pSVar28);
                    hs->tls13_state = 5;
                    sVar31 = ssl_hs_ok;
                  }
                  break;
                }
                uVar27 = (uint)ech_accepted;
              }
              else {
                __p_01 = OPENSSL_sk_new_null();
                std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                           this_02,(pointer)__p_01);
                if ((this_02->_M_t).
                    super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl !=
                    (stack_st_CRYPTO_BUFFER *)0x0) goto LAB_0015e3d0;
                uVar27 = 0x50;
              }
              ssl_send_alert(pSVar28,2,uVar27);
              goto LAB_0015dbde;
            }
          }
          ssl_send_alert(pSVar28,2,(uint)ech_accepted);
          sVar31 = ssl_hs_error;
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,0x2ce);
          break;
        }
      }
      else if (((uVar2 >> 9 & 1) == 0) &&
              (((pSVar28->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->reverify_on_resume !=
               false)) {
        hs->tls13_state = 7;
        goto LAB_0015db50;
      }
      hs->tls13_state = 8;
      goto LAB_0015db50;
    case 5:
      pSVar28 = hs->ssl;
      bVar16 = (*pSVar28->method->get_message)(pSVar28,(SSLMessage *)&server_hello);
      sVar31 = ssl_hs_read_message;
      if (bVar16) {
        if (server_hello.raw.data._1_1_ != '\x19') {
          bVar16 = ssl_check_message_type(pSVar28,(SSLMessage *)&server_hello,0xb);
          sVar31 = ssl_hs_error;
          if (!bVar16) break;
        }
        sVar31 = ssl_hs_error;
        bVar16 = tls13_process_certificate(hs,(SSLMessage *)&server_hello,false);
        if ((bVar16) && (bVar16 = ssl_hash_message(hs,(SSLMessage *)&server_hello), bVar16)) {
          (*pSVar28->method->next_message)(pSVar28);
          hs->tls13_state = 6;
          goto LAB_0015db50;
        }
      }
      break;
    case 6:
      pSVar28 = hs->ssl;
      bVar16 = (*pSVar28->method->get_message)(pSVar28,(SSLMessage *)&server_hello);
      sVar31 = ssl_hs_read_message;
      if (bVar16) {
        sVar20 = ssl_verify_peer_cert(hs);
        sVar31 = ssl_hs_error;
        if (sVar20 != ssl_verify_invalid) {
          iVar21 = 6;
          sStackY_1f0 = ssl_hs_certificate_verify;
          if (sVar20 != ssl_verify_retry) {
            bVar16 = ssl_check_message_type(pSVar28,(SSLMessage *)&server_hello,0xf);
            if (((!bVar16) ||
                (bVar16 = tls13_process_certificate_verify(hs,(SSLMessage *)&server_hello), !bVar16)
                ) || (bVar16 = ssl_hash_message(hs,(SSLMessage *)&server_hello), !bVar16)) break;
            (*pSVar28->method->next_message)(pSVar28);
            iVar21 = 8;
            sStackY_1f0 = ssl_hs_ok;
          }
          sVar31 = sStackY_1f0;
          hs->tls13_state = iVar21;
        }
      }
      break;
    case 7:
      sVar20 = ssl_reverify_peer_cert(hs,true);
      sVar31 = ssl_hs_error;
      if (sVar20 != ssl_verify_invalid) {
        iVar21 = 7;
        sVar31 = ssl_hs_certificate_verify;
        if (sVar20 != ssl_verify_retry) {
          iVar21 = 8;
          sVar31 = ssl_hs_ok;
        }
        goto LAB_0015d716;
      }
      break;
    case 8:
      pSVar28 = hs->ssl;
      bVar16 = (*pSVar28->method->get_message)(pSVar28,(SSLMessage *)&server_hello);
      sVar26 = 3;
      sVar31 = ssl_hs_read_message;
      if (bVar16) {
        bVar16 = ssl_check_message_type(pSVar28,(SSLMessage *)&server_hello,0x14);
        sVar31 = ssl_hs_error;
        if (bVar16) {
          sVar31 = ssl_hs_error;
          bVar16 = tls13_process_finished(hs,(SSLMessage *)&server_hello,false);
          if ((bVar16) && (bVar16 = ssl_hash_message(hs,(SSLMessage *)&server_hello), bVar16)) {
            puVar24 = (uchar *)SSLTranscript::DigestLen(this_01);
            in_04.size_ = sVar26;
            in_04.data_ = puVar24;
            bVar16 = tls13_advance_key_schedule((bssl *)hs,(SSL_HANDSHAKE *)kZeroes,in_04);
            if ((bVar16) && (bVar16 = tls13_derive_application_secrets(hs), bVar16)) {
              bVar16 = (*pSVar28->method->has_unprocessed_handshake_data)(pSVar28);
              if (bVar16) {
                ssl_send_alert(pSVar28,2,10);
                iVar21 = 0xff;
                iVar30 = 0x33e;
                goto LAB_0015deb5;
              }
              (*pSVar28->method->next_message)(pSVar28);
              hs->tls13_state = 9;
              goto LAB_0015db50;
            }
          }
        }
      }
      break;
    case 9:
      pSVar28 = hs->ssl;
      if ((pSVar28->s3->field_0xdd & 2) != 0) {
        iVar21 = SSL_is_quic(pSVar28);
        if ((iVar21 == 0) && (iVar21 = SSL_is_dtls(pSVar28), iVar21 == 0)) {
          CBB_zero((CBB *)&server_hello);
          bVar16 = (*pSVar28->method->init_message)(pSVar28,(CBB *)&server_hello,(CBB *)&msg,'\x05')
          ;
          if ((!bVar16) || (bVar16 = ssl_add_message_cbb(pSVar28,(CBB *)&server_hello), !bVar16))
          goto LAB_0015dcc1;
          internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                    ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&server_hello);
        }
        bVar16 = close_early_data(hs,ssl_encryption_handshake);
        sVar31 = ssl_hs_error;
        if (!bVar16) break;
      }
      hs->tls13_state = 10;
      goto LAB_0015db50;
    case 10:
      if (((((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->field_0x1b8 & 0x40) != 0)
         && (pSVar28 = hs->ssl, (pSVar28->s3->field_0xdd & 2) == 0)) {
        CBB_zero((CBB *)&server_hello);
        uVar18 = 0x44cd;
        if ((*(ushort *)&hs->config->field_0x10d >> 0xd & 1) == 0) {
          uVar18 = 0x4469;
        }
        bVar16 = (*pSVar28->method->init_message)(pSVar28,(CBB *)&server_hello,(CBB *)&msg,'\b');
        if (((((!bVar16) ||
              (iVar21 = CBB_add_u16_length_prefixed((CBB *)&msg,(CBB *)&cookie_value), iVar21 == 0))
             || (iVar21 = CBB_add_u16((CBB *)&cookie_value,uVar18), iVar21 == 0)) ||
            ((iVar21 = CBB_add_u16_length_prefixed((CBB *)&cookie_value,(CBB *)&cookie), iVar21 == 0
             || (psVar5 = (this->_M_t).
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                iVar21 = CBB_add_bytes((CBB *)&cookie,(psVar5->local_application_settings).data_,
                                       (psVar5->local_application_settings).size_), iVar21 == 0))))
           || (bVar16 = ssl_add_message_cbb(pSVar28,(CBB *)&server_hello), !bVar16)) {
LAB_0015dcc1:
          internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                    ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&server_hello);
          goto LAB_0015e517;
        }
        internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                  ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&server_hello);
      }
      hs->tls13_state = 0xb;
LAB_0015db50:
      sVar31 = ssl_hs_ok;
      break;
    case 0xb:
      if ((hs->field_0x6c8 & 0x20) == 0) {
        hs->tls13_state = 0xd;
        goto LAB_0015db50;
      }
      pSVar28 = hs->ssl;
      if (pSVar28->s3->ech_status == ssl_ech_rejected) {
        SSL_certs_clear(pSVar28);
      }
      else {
        pCVar6 = (hs->config->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
        p_Var7 = pCVar6->cert_cb;
        if (p_Var7 != (_func_int_SSL_ptr_void_ptr *)0x0) {
          iVar21 = (*p_Var7)(pSVar28,pCVar6->cert_cb_arg);
          if (iVar21 == 0) {
            ssl_send_alert(pSVar28,2,0x50);
            sVar31 = ssl_hs_error;
            ERR_put_error(0x10,0,0x7e,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,0x3a0);
          }
          else {
            if (-1 < iVar21) goto LAB_0015dc16;
            hs->tls13_state = 0xb;
            sVar31 = ssl_hs_x509_lookup;
          }
          break;
        }
      }
LAB_0015dc16:
      server_hello.raw.data = (uint8_t *)0x0;
      server_hello.raw.len = 0;
      bVar16 = ssl_get_full_credential_list(hs,(Array<ssl_credential_st_*> *)&server_hello);
      puVar14 = server_hello.raw.data;
      sVar31 = ssl_hs_error;
      if (bVar16) {
        if (server_hello.raw.len != 0) {
          lVar33 = server_hello.raw.len << 3;
          for (lVar32 = 0; lVar33 != lVar32; lVar32 = lVar32 + 8) {
            cred = *(SSL_CREDENTIAL **)(puVar14 + lVar32);
            ERR_clear_error();
            if (cred->type == kX509) {
              bVar16 = tls1_choose_signature_algorithm(hs,cred,(uint16_t *)&cookie_value);
              if ((bVar16) && (bVar16 = ssl_credential_matches_requested_issuers(hs,cred), bVar16))
              {
                SSL_CREDENTIAL_up_ref(cred);
                msg.is_v2_hello = false;
                msg.type = '\0';
                msg._2_6_ = 0;
                std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)this_00,
                           cred);
                std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)&msg);
                hs->signature_algorithm = (uint16_t)cookie_value.data;
                break;
              }
            }
            else {
              ERR_put_error(0x10,0,0xe4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x381);
            }
          }
          if ((this_00->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t
              .super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl ==
              (ssl_credential_st *)0x0) {
            uVar25 = ERR_peek_error();
            if ((int)uVar25 == 0) {
              __assert_fail("ERR_peek_error() != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x3bb,
                            "enum ssl_hs_wait_t bssl::do_send_client_certificate(SSL_HANDSHAKE *)");
            }
            ssl_send_alert(pSVar28,2,0x28);
            goto LAB_0015e1c6;
          }
        }
        bVar16 = tls13_add_certificate(hs);
        if (bVar16) {
          hs->tls13_state = 0xc;
          sVar31 = ssl_hs_ok;
        }
      }
LAB_0015e1c6:
      Array<ssl_credential_st_*>::~Array((Array<ssl_credential_st_*> *)&server_hello);
      break;
    case 0xc:
      iVar21 = 0xd;
      sVar31 = ssl_hs_ok;
      if ((this_00->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl != (ssl_credential_st *)0x0
         ) {
        sVar19 = tls13_add_certificate_verify(hs);
        iVar21 = 0xd;
        sVar31 = ssl_hs_ok;
        if (sVar19 != ssl_private_key_success) {
          sVar31 = ssl_hs_error;
          if (sVar19 == ssl_private_key_failure) break;
          if (sVar19 != ssl_private_key_retry) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,0x3dd,
                          "enum ssl_hs_wait_t bssl::do_send_client_certificate_verify(SSL_HANDSHAKE *)"
                         );
          }
          iVar21 = 0xc;
          sVar31 = ssl_hs_private_key_operation;
        }
      }
LAB_0015d716:
      hs->tls13_state = iVar21;
      break;
    case 0xd:
      pSVar28 = hs->ssl;
      uVar27 = *(uint *)&hs->field_0x6c8;
      *(uint *)&hs->field_0x6c8 = uVar27 | 0x800000;
      if ((uVar27 >> 0x18 & 1) != 0) {
        CBB_zero((CBB *)&server_hello);
        bVar16 = (*pSVar28->method->init_message)(pSVar28,(CBB *)&server_hello,(CBB *)&msg,0xcb);
        if (((!bVar16) || (bVar16 = tls1_write_channel_id(hs,(CBB *)&msg), !bVar16)) ||
           (bVar16 = ssl_add_message_cbb(pSVar28,(CBB *)&server_hello), !bVar16)) {
          internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                    ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&server_hello);
LAB_0015dbde:
          sVar31 = ssl_hs_error;
          break;
        }
        internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                  ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&server_hello);
      }
      bVar16 = tls13_add_finished(hs);
      sVar31 = ssl_hs_error;
      if (bVar16) {
        in_R9 = (ulong)(hs->client_traffic_secret_0).size_;
        traffic_secret.size_._7_1_ = ech_accepted;
        traffic_secret._0_15_ = auStack_1e8;
        bVar16 = tls13_set_traffic_key
                           ((bssl *)pSVar28,(SSL *)0x3,ssl_encryption_early_data,
                            (evp_aead_direction_t)
                            (hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                            (SSL_SESSION *)&hs->client_traffic_secret_0,traffic_secret);
        sVar31 = ssl_hs_error;
        if (bVar16) {
          in_R9 = (ulong)(hs->server_traffic_secret_0).size_;
          sVar31 = ssl_hs_error;
          traffic_secret_00.size_._7_1_ = ech_accepted;
          traffic_secret_00._0_15_ = auStack_1e8;
          bVar16 = tls13_set_traffic_key
                             ((bssl *)pSVar28,(SSL *)0x3,ssl_encryption_initial,
                              (evp_aead_direction_t)
                              (hs->new_session)._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                              (SSL_SESSION *)&hs->server_traffic_secret_0,traffic_secret_00);
          if ((bVar16) &&
             (bVar16 = tls13_derive_resumption_secret(hs), sVar31 = ssl_hs_error, bVar16)) {
            hs->tls13_state = 0xe;
            goto LAB_0015d770;
          }
        }
      }
      break;
    case 0xe:
      return ssl_hs_ok;
    }
    if (hs->tls13_state != iVar3) {
      ssl_do_info_callback(hs->ssl,0x1001,1);
    }
    if (sVar31 != ssl_hs_ok) {
      return sVar31;
    }
  } while( true );
}

Assistant:

enum ssl_hs_wait_t tls13_client_handshake(SSL_HANDSHAKE *hs) {
  while (hs->tls13_state != state_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum client_hs_state_t state =
        static_cast<enum client_hs_state_t>(hs->tls13_state);
    switch (state) {
      case state_read_hello_retry_request:
        ret = do_read_hello_retry_request(hs);
        break;
      case state_send_second_client_hello:
        ret = do_send_second_client_hello(hs);
        break;
      case state_read_server_hello:
        ret = do_read_server_hello(hs);
        break;
      case state_read_encrypted_extensions:
        ret = do_read_encrypted_extensions(hs);
        break;
      case state_read_certificate_request:
        ret = do_read_certificate_request(hs);
        break;
      case state_read_server_certificate:
        ret = do_read_server_certificate(hs);
        break;
      case state_read_server_certificate_verify:
        ret = do_read_server_certificate_verify(hs);
        break;
      case state_server_certificate_reverify:
        ret = do_server_certificate_reverify(hs);
        break;
      case state_read_server_finished:
        ret = do_read_server_finished(hs);
        break;
      case state_send_end_of_early_data:
        ret = do_send_end_of_early_data(hs);
        break;
      case state_send_client_certificate:
        ret = do_send_client_certificate(hs);
        break;
      case state_send_client_encrypted_extensions:
        ret = do_send_client_encrypted_extensions(hs);
        break;
      case state_send_client_certificate_verify:
        ret = do_send_client_certificate_verify(hs);
        break;
      case state_complete_second_flight:
        ret = do_complete_second_flight(hs);
        break;
      case state_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->tls13_state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_CONNECT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  return ssl_hs_ok;
}